

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

shared_ptr<Image> __thiscall Image::fromPNG(Image *this,string *file_name)

{
  uint uVar1;
  pointer puVar2;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Image> sVar3;
  
  puVar2 = (pointer)operator_new(0x48);
  puVar2[8] = '\x01';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[0xc] = '\x01';
  puVar2[0xd] = '\0';
  puVar2[0xe] = '\0';
  puVar2[0xf] = '\0';
  *(undefined ***)puVar2 = &PTR___Sp_counted_ptr_inplace_0011bcb0;
  puVar2[0x30] = '\0';
  puVar2[0x31] = '\0';
  puVar2[0x32] = '\0';
  puVar2[0x33] = '\0';
  puVar2[0x34] = '\0';
  puVar2[0x35] = '\0';
  puVar2[0x36] = '\0';
  puVar2[0x37] = '\0';
  puVar2[0x38] = '\0';
  puVar2[0x39] = '\0';
  puVar2[0x3a] = '\0';
  puVar2[0x3b] = '\0';
  puVar2[0x3c] = '\0';
  puVar2[0x3d] = '\0';
  puVar2[0x3e] = '\0';
  puVar2[0x3f] = '\0';
  puVar2[0x10] = '\0';
  puVar2[0x11] = '\0';
  puVar2[0x12] = '\0';
  puVar2[0x13] = '\0';
  puVar2[0x14] = '\0';
  puVar2[0x15] = '\0';
  puVar2[0x16] = '\0';
  puVar2[0x17] = '\0';
  puVar2[0x18] = '\0';
  puVar2[0x19] = '\0';
  puVar2[0x1a] = '\0';
  puVar2[0x1b] = '\0';
  puVar2[0x1c] = '\0';
  puVar2[0x1d] = '\0';
  puVar2[0x1e] = '\0';
  puVar2[0x1f] = '\0';
  puVar2[0x20] = '\0';
  puVar2[0x21] = '\0';
  puVar2[0x22] = '\0';
  puVar2[0x23] = '\0';
  puVar2[0x24] = '\0';
  puVar2[0x25] = '\0';
  puVar2[0x26] = '\0';
  puVar2[0x27] = '\0';
  puVar2[0x28] = '\0';
  puVar2[0x29] = '\0';
  puVar2[0x2a] = '\0';
  puVar2[0x2b] = '\0';
  puVar2[0x2c] = '\0';
  puVar2[0x2d] = '\0';
  puVar2[0x2e] = '\0';
  puVar2[0x2f] = '\0';
  puVar2[0x38] = '\x04';
  puVar2[0x39] = '\0';
  puVar2[0x3a] = '\0';
  puVar2[0x3b] = '\0';
  puVar2[0x40] = '\0';
  puVar2[0x41] = '\0';
  puVar2[0x42] = '\0';
  puVar2[0x43] = '\0';
  puVar2[0x44] = '\0';
  puVar2[0x45] = '\0';
  puVar2[0x46] = 0xf0;
  puVar2[0x47] = '?';
  (this->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar2;
  this->pixels = (Pixel *)(puVar2 + 0x10);
  uVar1 = lodepng::decode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar2 + 0x18),
                          (uint *)(puVar2 + 0x30),(uint *)(puVar2 + 0x34),file_name,LCT_RGBA,8);
  *(pointer *)(puVar2 + 0x10) =
       (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar2 + 0x18))->
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  if (uVar1 == 0) {
    sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<Image>)sVar3.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Could not load image.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Image> Image::fromPNG(const std::string &file_name) {

  auto img = std::make_shared<Image>();

  // Use lodepng to decode a PNG file
  unsigned int err = lodepng::decode(img->raw, img->width, img->height, file_name, LCT_RGBA);

  // Set the pixel pointer to the start of the raw buffer
  img->pixels = reinterpret_cast<Pixel *>(img->raw.data());

  if (err) {
    throw std::runtime_error("Could not load image.");
  }

  return img;
}